

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::SdfAnnotateTask::SdfAnnotateTask(SdfAnnotateTask *this)

{
  allocator<char> local_31;
  string local_30;
  SdfAnnotateTask *local_10;
  SdfAnnotateTask *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"$sdf_annotate",&local_31);
  SystemTaskBase::SystemTaskBase(&this->super_SystemTaskBase,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_SystemTaskBase).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SdfAnnotateTask_00917850;
  return;
}

Assistant:

SdfAnnotateTask() : SystemTaskBase("$sdf_annotate") {}